

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVodeReInit(void *cvode_mem,sunrealtype t0,N_Vector y0)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x234;
  }
  else if (*(int *)((long)cvode_mem + 0x46c) == 0) {
    msgfmt = "Attempt to call before CVodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
    line = 0x23f;
  }
  else {
    if (y0 != (N_Vector)0x0) {
      *(sunrealtype *)((long)cvode_mem + 0x168) = t0;
      *(undefined4 *)((long)cvode_mem + 0x120) = 1;
      *(undefined8 *)((long)cvode_mem + 300) = 0x200000002;
      *(undefined8 *)((long)cvode_mem + 0x2f8) = *(undefined8 *)((long)cvode_mem + 0x310);
      *(undefined4 *)((long)cvode_mem + 0x428) = 0;
      *(undefined8 *)((long)cvode_mem + 0x440) = 0;
      *(undefined8 *)((long)cvode_mem + 0x458) = 0x3ff0000000000000;
      N_VScale(0,y0,*(undefined8 *)((long)cvode_mem + 0x60));
      *(undefined4 *)((long)cvode_mem + 0x550) = 0;
      *(undefined8 *)((long)cvode_mem + 0x5c8) = 0;
      *(undefined4 *)((long)cvode_mem + 0x5c4) = 0;
      *(undefined8 *)((long)cvode_mem + 0x150) = 0;
      *(undefined4 *)((long)cvode_mem + 0x128) = 0;
      *(undefined8 *)((long)cvode_mem + 0x558) = 0;
      *(undefined8 *)((long)cvode_mem + 0x358) = 0;
      *(undefined8 *)((long)cvode_mem + 0x360) = 0;
      *(undefined8 *)((long)cvode_mem + 0x368) = 0;
      *(undefined8 *)((long)cvode_mem + 0x370) = 0;
      *(undefined8 *)((long)cvode_mem + 0x378) = 0;
      *(undefined8 *)((long)cvode_mem + 0x380) = 0;
      *(undefined8 *)((long)cvode_mem + 900) = 0;
      *(undefined8 *)((long)cvode_mem + 0x38c) = 0;
      *(undefined8 *)((long)cvode_mem + 0x430) = 0;
      *(undefined8 *)((long)cvode_mem + 0x438) = 0;
      *(undefined8 *)((long)cvode_mem + 0x490) = 0;
      *(undefined8 *)((long)cvode_mem + 0x498) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4a0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4b0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4b8) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4c0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4d0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4d8) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4e0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x500) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4f0) = 0;
      *(undefined8 *)((long)cvode_mem + 0x4f8) = 0;
      *(undefined8 *)((long)cvode_mem + 0x520) = 0;
      *(undefined8 *)((long)cvode_mem + 0x510) = 0;
      *(undefined8 *)((long)cvode_mem + 0x518) = 0;
      return 0;
    }
    msgfmt = "y0 = NULL illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x249;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeReInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeReInit(void* cvode_mem, sunrealtype t0, N_Vector y0)
{
  CVodeMem cv_mem;
  int i, k;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_MALLOC);
  }

  /* Check for legal input parameters */

  if (y0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_Y0);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Copy the input parameters into CVODE state */

  cv_mem->cv_tn = t0;

  /* Set step parameters */

  cv_mem->cv_q      = 1;
  cv_mem->cv_L      = 2;
  cv_mem->cv_qwait  = cv_mem->cv_L;
  cv_mem->cv_etamax = cv_mem->cv_eta_max_fs;

  cv_mem->cv_qu    = 0;
  cv_mem->cv_hu    = ZERO;
  cv_mem->cv_tolsf = ONE;

  /* Initialize zn[0] in the history array */

  N_VScale(ONE, y0, cv_mem->cv_zn[0]);

  /* Initialize all the counters */

  cv_mem->cv_nst     = 0;
  cv_mem->cv_nfe     = 0;
  cv_mem->cv_ncfn    = 0;
  cv_mem->cv_netf    = 0;
  cv_mem->cv_nni     = 0;
  cv_mem->cv_nnf     = 0;
  cv_mem->cv_nsetups = 0;
  cv_mem->cv_nhnil   = 0;
  cv_mem->cv_nstlp   = 0;
  cv_mem->cv_nscon   = 0;
  cv_mem->cv_nge     = 0;

  cv_mem->cv_irfnd = 0;

  /* Initialize other integrator optional outputs */

  cv_mem->cv_h0u    = ZERO;
  cv_mem->cv_next_h = ZERO;
  cv_mem->cv_next_q = 0;

  /* Initialize Stablilty Limit Detection data */

  cv_mem->cv_nor = 0;
  for (i = 1; i <= 5; i++)
  {
    for (k = 1; k <= 3; k++) { cv_mem->cv_ssdat[i - 1][k - 1] = ZERO; }
  }

  /* Problem has been successfully re-initialized */

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}